

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2crossing_edge_query.cc
# Opt level: O2

bool __thiscall
S2CrossingEdgeQuery::VisitCells
          (S2CrossingEdgeQuery *this,S2Point *a0,S2Point *a1,CellVisitor *visitor)

{
  VType VVar1;
  bool bVar2;
  CellRelation CVar3;
  S2CellId target;
  S2ShapeIndexCell *__args;
  Iterator *it;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  S2PaddedCell *pSVar7;
  S2PaddedCell *pSVar8;
  byte bVar9;
  S2CellId local_210;
  R2Rect edge_bound;
  S2PaddedCell local_1e8;
  S2PaddedCell pcell;
  FaceSegmentVector segments;
  
  bVar9 = 0;
  this->visitor_ = visitor;
  segments.allocator_and_tag_.tag_.size_ = (Tag)0;
  S2::GetFaceSegments(a0,a1,&segments);
  uVar6 = segments.rep_._8_8_;
  if (((ulong)segments.allocator_and_tag_.tag_.size_ & 1) == 0) {
    uVar6 = &segments.rep_;
  }
  it = &this->iter_;
  for (lVar5 = ((ulong)segments.allocator_and_tag_.tag_.size_ >> 1) * 0x28; lVar5 != 0;
      lVar5 = lVar5 + -0x28) {
    VVar1 = *(VType *)(uVar6 + 0x10);
    (this->a0_).c_[0] = *(VType *)(uVar6 + 8);
    (this->a0_).c_[1] = VVar1;
    VVar1 = *(VType *)(uVar6 + 0x20);
    (this->a1_).c_[0] = *(VType *)(uVar6 + 0x18);
    (this->a1_).c_[1] = VVar1;
    R2Rect::FromPointPair(&edge_bound,&this->a0_,&this->a1_);
    S2PaddedCell::S2PaddedCell
              (&pcell,(S2CellId)(((ulong)*(uint *)uVar6 << 0x3d) + 0x1000000000000000),0.0);
    target = S2PaddedCell::ShrinkToFit(&pcell,&edge_bound);
    CVar3 = S2ShapeIndex::IteratorBase::LocateImpl<S2ShapeIndex::Iterator>(target,it);
    if (CVar3 == SUBDIVIDED) {
      if ((target.id_ & 0xfffffffffffffff) != 0) {
        S2PaddedCell::S2PaddedCell(&local_1e8,target,0.0);
        pSVar7 = &local_1e8;
        pSVar8 = &pcell;
        for (lVar4 = 0xc; lVar4 != 0; lVar4 = lVar4 + -1) {
          (pSVar8->id_).id_ = (pSVar7->id_).id_;
          pSVar7 = (S2PaddedCell *)((long)pSVar7 + (ulong)bVar9 * -0x10 + 8);
          pSVar8 = (S2PaddedCell *)((long)pSVar8 + (ulong)bVar9 * -0x10 + 8);
        }
      }
      bVar2 = VisitCells(this,&pcell,&edge_bound);
LAB_00229626:
      if (bVar2 == false) break;
    }
    else if (CVar3 == INDEXED) {
      local_210.id_ =
           (((it->iter_)._M_t.
             super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
             ._M_t.
             super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
             .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl)->id_).id_;
      bVar2 = S2CellId::contains(&local_210,target);
      if (!bVar2) {
        S2LogMessage::S2LogMessage
                  ((S2LogMessage *)&local_1e8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2crossing_edge_query.cc"
                   ,0xe4,kFatal,(ostream *)&std::cerr);
        std::operator<<((ostream *)local_1e8.padding_,
                        "Check failed: iter_.id().contains(edge_root) ");
        abort();
      }
      __args = S2ShapeIndex::Iterator::cell(it);
      bVar2 = std::function<bool_(const_S2ShapeIndexCell_&)>::operator()(visitor,__args);
      goto LAB_00229626;
    }
    uVar6 = uVar6 + 0x28;
  }
  absl::InlinedVector<S2::FaceSegment,_6UL,_std::allocator<S2::FaceSegment>_>::clear(&segments);
  return lVar5 == 0;
}

Assistant:

bool S2CrossingEdgeQuery::VisitCells(const S2Point& a0, const S2Point& a1,
                                     const CellVisitor& visitor) {
  visitor_ = &visitor;
  S2::FaceSegmentVector segments;
  S2::GetFaceSegments(a0, a1, &segments);
  for (const auto& segment : segments) {
    a0_ = segment.a;
    a1_ = segment.b;

    // Optimization: rather than always starting the recursive subdivision at
    // the top level face cell, instead we start at the smallest S2CellId that
    // contains the edge (the "edge root cell").  This typically lets us skip
    // quite a few levels of recursion since most edges are short.
    R2Rect edge_bound = R2Rect::FromPointPair(a0_, a1_);
    S2PaddedCell pcell(S2CellId::FromFace(segment.face), 0);
    S2CellId edge_root = pcell.ShrinkToFit(edge_bound);

    // Now we need to determine how the edge root cell is related to the cells
    // in the spatial index (cell_map_).  There are three cases:
    //
    //  1. edge_root is an index cell or is contained within an index cell.
    //     In this case we only need to look at the contents of that cell.
    //  2. edge_root is subdivided into one or more index cells.  In this case
    //     we recursively subdivide to find the cells intersected by a0a1.
    //  3. edge_root does not intersect any index cells.  In this case there
    //     is nothing to do.
    S2ShapeIndex::CellRelation relation = iter_.Locate(edge_root);
    if (relation == S2ShapeIndex::INDEXED) {
      // edge_root is an index cell or is contained by an index cell (case 1).
      S2_DCHECK(iter_.id().contains(edge_root));
      if (!visitor(iter_.cell())) return false;
    } else if (relation == S2ShapeIndex::SUBDIVIDED) {
      // edge_root is subdivided into one or more index cells (case 2).  We
      // find the cells intersected by a0a1 using recursive subdivision.
      if (!edge_root.is_face()) pcell = S2PaddedCell(edge_root, 0);
      if (!VisitCells(pcell, edge_bound)) return false;
    }
  }
  return true;
}